

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::SystemIdentifier
          (SystemIdentifier *this,SystemIdentifier *param_1)

{
  KUINT16 KVar1;
  anon_union_1_2_a45434d2_for_SystemIdentifier_4 aVar2;
  SystemIdentifier *param_1_local;
  SystemIdentifier *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SystemIdentifier_00331b48;
  KVar1 = param_1->m_ui16SystemName;
  this->m_ui16SystemType = param_1->m_ui16SystemType;
  this->m_ui16SystemName = KVar1;
  aVar2 = param_1->field_3;
  this->m_ui8SystemMode = param_1->m_ui8SystemMode;
  this->field_3 = aVar2;
  return;
}

Assistant:

class KDIS_EXPORT SystemIdentifier : public DataTypeBase
{
protected:

    KUINT16 m_ui16SystemType;

    KUINT16 m_ui16SystemName;

    KUINT8 m_ui8SystemMode;

    union
    {
        struct
        {
            KUINT8 m_ui8ChangeIndicator : 1;
            KUINT8 m_ui8AltMode4        : 1;
            KUINT8 m_ui8AltModeC        : 1;
            // Bits 3-7 not used
        };

        KUINT8 m_ui8ChangeOptions;
    };

public:

    static const KUINT16 SYSTEM_IDENTIFER_SIZE = 6;

    SystemIdentifier();

    SystemIdentifier( KDIS::DATA_TYPE::ENUMS::SystemType T, KDIS::DATA_TYPE::ENUMS::SystemName N, KDIS::DATA_TYPE::ENUMS::SystemMode M, 
		              KBOOL ChangeIndicator, KBOOL AltMode4 = false, KBOOL AltModeC = false );

    SystemIdentifier(KDataStream &stream) noexcept(false);

    virtual ~SystemIdentifier();

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::SetSystemType
    //              KDIS::DATA_TYPE::SystemIdentifier::GetSystemType
    // Description: System Type
    // Parameter:   SystemType T
    //************************************
    void SetSystemType( KDIS::DATA_TYPE::ENUMS::SystemType T );
    KDIS::DATA_TYPE::ENUMS::SystemType GetSystemType() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::SetSystemName
    //              KDIS::DATA_TYPE::SystemIdentifier::GetSystemName
    // Description: A particular named type of system
    // Parameter:   SystemName ID
    //************************************
    void SetSystemName( KDIS::DATA_TYPE::ENUMS::SystemName N );
    KDIS::DATA_TYPE::ENUMS::SystemName GetSystemName() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::SetSystemMode
    //              KDIS::DATA_TYPE::SystemIdentifier::GetSystemMode
    // Description: Mode of operation for the named system.
    // Parameter:   SystemMode M
    //************************************
    void SetSystemMode( KDIS::DATA_TYPE::ENUMS::SystemMode M );
    KDIS::DATA_TYPE::ENUMS::SystemMode GetSystemMode() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::SetChangeOptions
    //              KDIS::DATA_TYPE::SystemIdentifier::GetChangeOptions
    // Description: Used to specifiy the status of the PDU(existence of
    //              changes from previous indicators for alternative fields etc).
    //              Note: Alternative Mode 4 and Alternative Mode C changes
    //              only apply to Mark X/XII/ATCRBS/MODE S Transponder and
    //              Mark X/XII/ATCRBS/MODE S Interrogator systems.
    // Parameter:   KBOOL ChangeIndicator
    // Parameter:   KBOOL AltMode4
    // Parameter:   KBOOL AltModeC
    //************************************
    void SetChangeOptions( KBOOL ChangeIndicator, KBOOL AltMode4, KBOOL AltModeC );
    void SetChangeIndicator( KBOOL CI );
    void SetAltMode4( KBOOL AM );
    void SetAltModeC( KBOOL AM );
    KBOOL GetChangeIndicator() const;
    KBOOL GetAltMode4() const;
    KBOOL GetAltModeC() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::SystemIdentifier::DataTypeBase::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::SystemIdentifier::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const SystemIdentifier & Value ) const;
    KBOOL operator != ( const SystemIdentifier & Value ) const;
}